

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::CreateCNAME(RTPSession *this,uint8_t *buffer,size_t *bufferlength,bool resolve)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char local_458 [8];
  char hostname [1024];
  size_t sStack_50;
  int status;
  size_t buflen2;
  size_t offset;
  char *logname;
  char *loginname;
  bool gotlogin;
  size_t *psStack_28;
  bool resolve_local;
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPSession *this_local;
  
  loginname._6_1_ = 1;
  *buffer = '\0';
  loginname._7_1_ = resolve;
  psStack_28 = bufferlength;
  bufferlength_local = (size_t *)buffer;
  buffer_local = (uint8_t *)this;
  iVar2 = getlogin_r((char *)buffer,*bufferlength);
  if (iVar2 == 0) {
    if ((char)*bufferlength_local == '\0') {
      loginname._6_1_ = 0;
    }
  }
  else {
    loginname._6_1_ = 0;
  }
  if ((loginname._6_1_ & 1) == 0) {
    logname = getlogin();
    if (logname == (char *)0x0) {
      loginname._6_1_ = 0;
    }
    else {
      strncpy((char *)bufferlength_local,logname,*psStack_28);
    }
  }
  if ((loginname._6_1_ & 1) == 0) {
    offset = (size_t)getenv("LOGNAME");
    if ((char *)offset == (char *)0x0) {
      return -0x3b;
    }
    strncpy((char *)bufferlength_local,(char *)offset,*psStack_28);
  }
  *(undefined1 *)((long)bufferlength_local + (*psStack_28 - 1)) = 0;
  sVar3 = strlen((char *)bufferlength_local);
  if (sVar3 < *psStack_28 - 1) {
    *(undefined1 *)((long)bufferlength_local + sVar3) = 0x40;
  }
  buflen2 = sVar3 + 1;
  sStack_50 = *psStack_28 - buflen2;
  if ((loginname._7_1_ & 1) == 0) {
    strncpy(local_458,"localhost",0x400);
    gethostname(local_458,0x400);
    strncpy((char *)((long)bufferlength_local + buflen2),local_458,sStack_50);
    sVar1 = buflen2;
    sVar3 = strlen(local_458);
    *psStack_28 = sVar1 + sVar3;
  }
  else {
    iVar2 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])
                      (this->rtptrans,(long)bufferlength_local + buflen2,&stack0xffffffffffffffb0);
    if (iVar2 < 0) {
      return iVar2;
    }
    *psStack_28 = sStack_50 + buflen2;
  }
  if (0xff < *psStack_28) {
    *psStack_28 = 0xff;
  }
  return 0;
}

Assistant:

int RTPSession::CreateCNAME(uint8_t *buffer,size_t *bufferlength,bool resolve)
{
#ifndef WIN32
	bool gotlogin = true;
#ifdef RTP_SUPPORT_GETLOGINR
	buffer[0] = 0;
	if (getlogin_r((char *)buffer,*bufferlength) != 0)
		gotlogin = false;
	else
	{
		if (buffer[0] == 0)
			gotlogin = false;
	}
	
	if (!gotlogin) // try regular getlogin
	{
		char *loginname = getlogin();
		if (loginname == 0)
			gotlogin = false;
		else
			strncpy((char *)buffer,loginname,*bufferlength);
	}
#else
	char *loginname = getlogin();
	if (loginname == 0)
		gotlogin = false;
	else
		strncpy((char *)buffer,loginname,*bufferlength);
#endif // RTP_SUPPORT_GETLOGINR
	if (!gotlogin)
	{
		char *logname = getenv("LOGNAME");
		if (logname == 0)
			return ERR_RTP_SESSION_CANTGETLOGINNAME;
		strncpy((char *)buffer,logname,*bufferlength);
	}
#else // Win32 version

#ifndef _WIN32_WCE
	DWORD len = *bufferlength;
	if (!GetUserName((LPTSTR)buffer,&len))
		RTP_STRNCPY((char *)buffer,"unknown",*bufferlength);
#else 
	RTP_STRNCPY((char *)buffer,"unknown",*bufferlength);
#endif // _WIN32_WCE
	
#endif // WIN32
	buffer[*bufferlength-1] = 0;

	size_t offset = strlen((const char *)buffer);
	if (offset < (*bufferlength-1))
		buffer[offset] = (uint8_t)'@';
	offset++;

	size_t buflen2 = *bufferlength-offset;
	int status;
	
	if (resolve)
	{
		if ((status = rtptrans->GetLocalHostName(buffer+offset,&buflen2)) < 0)
			return status;
		*bufferlength = buflen2+offset;
	}
	else
	{
		char hostname[1024];
		
		RTP_STRNCPY(hostname,"localhost",1024); // just in case gethostname fails

		gethostname(hostname,1024);
		RTP_STRNCPY((char *)(buffer+offset),hostname,buflen2);

		*bufferlength = offset+strlen(hostname);
	}
	if (*bufferlength > RTCP_SDES_MAXITEMLENGTH)
		*bufferlength = RTCP_SDES_MAXITEMLENGTH;
	return 0;
}